

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinycthread.c
# Opt level: O2

int thrd_create(thrd_t *thr,thrd_start_t func,void *arg)

{
  int iVar1;
  undefined8 *__arg;
  
  __arg = (undefined8 *)malloc(0x10);
  if (__arg == (undefined8 *)0x0) {
    iVar1 = 4;
  }
  else {
    *__arg = func;
    __arg[1] = arg;
    iVar1 = pthread_create(thr,(pthread_attr_t *)0x0,_thrd_wrapper_function,__arg);
    if (iVar1 == 0) {
      if (*thr != 0) {
        return 1;
      }
    }
    else {
      *thr = 0;
    }
    free(__arg);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int thrd_create(thrd_t *thr, thrd_start_t func, void *arg)
{
  /* Fill out the thread startup information (passed to the thread wrapper,
     which will eventually free it) */
  _thread_start_info* ti = (_thread_start_info*)malloc(sizeof(_thread_start_info));
  if (ti == NULL)
  {
    return thrd_nomem;
  }
  ti->mFunction = func;
  ti->mArg = arg;

  /* Create the thread */
#if defined(_TTHREAD_WIN32_)
  *thr = (HANDLE)_beginthreadex(NULL, 0, _thrd_wrapper_function, (void *)ti, 0, NULL);
#elif defined(_TTHREAD_POSIX_)
  if(pthread_create(thr, NULL, _thrd_wrapper_function, (void *)ti) != 0)
  {
    *thr = 0;
  }
#endif

  /* Did we fail to create the thread? */
  if(!*thr)
  {
    free(ti);
    return thrd_error;
  }

  return thrd_success;
}